

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialvalue.cpp
# Opt level: O0

void __thiscall
ConfidentialValue_Constractor_bytedata_err_Test::TestBody
          (ConfidentialValue_Constractor_bytedata_err_Test *this)

{
  bool bVar1;
  AssertHelper local_b0;
  Message local_a8 [2];
  CfdException *anon_var_0;
  string local_90;
  ByteData local_70;
  undefined1 local_58 [8];
  ConfidentialValue value;
  char *pcStack_18;
  bool gtest_caught_expected;
  ConstCharPtr gtest_msg;
  ConfidentialValue_Constractor_bytedata_err_Test *this_local;
  
  gtest_msg.value = (char *)this;
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xffffffffffffffe8,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xffffffffffffffe8);
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_90,"001122",(allocator *)((long)&anon_var_0 + 7));
      cfd::core::ByteData::ByteData(&local_70,&local_90);
      cfd::core::ConfidentialValue::ConfidentialValue((ConfidentialValue *)local_58,&local_70);
      cfd::core::ByteData::~ByteData(&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::allocator<char>::~allocator((allocator<char> *)((long)&anon_var_0 + 7));
      cfd::core::ConfidentialValue::~ConfidentialValue((ConfidentialValue *)local_58);
    }
    pcStack_18 = 
    "Expected: ConfidentialValue value(ByteData(\"001122\")) throws an exception of type CfdException.\n  Actual: it throws nothing."
    ;
  }
  testing::Message::Message(local_a8);
  testing::internal::AssertHelper::AssertHelper
            (&local_b0,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialvalue.cpp"
             ,0x8d,pcStack_18);
  testing::internal::AssertHelper::operator=(&local_b0,local_a8);
  testing::internal::AssertHelper::~AssertHelper(&local_b0);
  testing::Message::~Message(local_a8);
  return;
}

Assistant:

TEST(ConfidentialValue, Constractor_bytedata_err) {
  // error
  EXPECT_THROW(ConfidentialValue value(ByteData("001122")), CfdException);
}